

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O3

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *pos,uint32_t options,
          SymbolTable *symbols,UErrorCode *status)

{
  UnicodeString rebuiltPat;
  RuleCharacterIterator chars;
  UnicodeString local_88;
  RuleCharacterIterator local_48;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) {
      local_88.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0
      ;
      local_88.fUnion.fStackFields.fLengthAndFlags = 2;
      RuleCharacterIterator::RuleCharacterIterator(&local_48,pattern,symbols,pos);
      applyPattern(this,&local_48,symbols,&local_88,options,0,0x31f3ac,(UErrorCode *)0x0);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (local_48.buf == (UnicodeString *)0x0) {
          setPattern(this,&local_88);
        }
        else {
          *status = U_MALFORMED_SET;
        }
      }
      UnicodeString::~UnicodeString(&local_88);
    }
    else {
      *status = U_NO_WRITE_PERMISSION;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                              ParsePosition& pos,
                              uint32_t options,
                              const SymbolTable* symbols,
                              UErrorCode& status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (isFrozen()) {
        status = U_NO_WRITE_PERMISSION;
        return *this;
    }
    // Need to build the pattern in a temporary string because
    // _applyPattern calls add() etc., which set pat to empty.
    UnicodeString rebuiltPat;
    RuleCharacterIterator chars(pattern, symbols, pos);
    applyPattern(chars, symbols, rebuiltPat, options, &UnicodeSet::closeOver, 0, status);
    if (U_FAILURE(status)) return *this;
    if (chars.inVariable()) {
        // syntaxError(chars, "Extra chars in variable value");
        status = U_MALFORMED_SET;
        return *this;
    }
    setPattern(rebuiltPat);
    return *this;
}